

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_simplification.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConjunctionSimplificationRule::RemoveExpression
          (ConjunctionSimplificationRule *this,BoundConjunctionExpression *conj,Expression *expr)

{
  Expression *this_00;
  reference pvVar1;
  ConjunctionSimplificationRule *pCVar2;
  Expression *in_RCX;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  size_type __n;
  
  this_00 = expr + 1;
  if (*(_func_int ***)&expr[1].super_BaseExpression.type !=
      expr[1].super_BaseExpression._vptr_BaseExpression) {
    __n = 0;
    do {
      pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)this_00,__n);
      if ((pvVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == in_RCX) {
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::erase_at((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)this_00,__n);
        break;
      }
      __n = __n + 1;
    } while (__n < (ulong)(*(long *)&expr[1].super_BaseExpression.type -
                           (long)expr[1].super_BaseExpression._vptr_BaseExpression >> 3));
  }
  if (*(long *)&expr[1].super_BaseExpression.type -
      (long)expr[1].super_BaseExpression._vptr_BaseExpression == 8) {
    pCVar2 = (ConjunctionSimplificationRule *)
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)this_00,0);
    _Var3._M_head_impl =
         (((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
            *)&(pCVar2->super_Rule)._vptr_Rule)->
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  }
  else {
    _Var3._M_head_impl = (Expression *)0x0;
    pCVar2 = this;
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)_Var3._M_head_impl;
  (((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true> *)
   &(pCVar2->super_Rule)._vptr_Rule)->
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ConjunctionSimplificationRule::RemoveExpression(BoundConjunctionExpression &conj,
                                                                       const Expression &expr) {
	for (idx_t i = 0; i < conj.children.size(); i++) {
		if (conj.children[i].get() == &expr) {
			// erase the expression
			conj.children.erase_at(i);
			break;
		}
	}
	if (conj.children.size() == 1) {
		// one expression remaining: simply return that expression and erase the conjunction
		return std::move(conj.children[0]);
	}
	return nullptr;
}